

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall
RegisterGraphTestRuleVariablesInScope::RegisterGraphTestRuleVariablesInScope
          (RegisterGraphTestRuleVariablesInScope *this)

{
  RegisterGraphTestRuleVariablesInScope *this_local;
  
  RegisterTest(GraphTestRuleVariablesInScope::Create,"GraphTest.RuleVariablesInScope");
  return;
}

Assistant:

TEST_F(GraphTest, RuleVariablesInScope) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule r\n"
"  depfile = x\n"
"  command = depfile is $depfile\n"
"build out: r in\n"));
  Edge* edge = GetNode("out")->in_edge();
  EXPECT_EQ("depfile is x", edge->EvaluateCommand());
}